

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_>::ClearNodeVector
          (TMap<int,_MapinfoEdMapItem,_THashTraits<int>,_TValueTraits<MapinfoEdMapItem>_> *this)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = this->Size;
  if (uVar1 != 0) {
    lVar2 = 0x30;
    uVar3 = 0;
    do {
      if (*(long *)((long)(&this->Nodes->Pair + -1) + lVar2) != 1) {
        FString::~FString((FString *)((long)(this->Nodes->Pair).Value.args + lVar2 + -0x18));
        uVar1 = this->Size;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x40;
    } while (uVar3 < uVar1);
  }
  M_Free(this->Nodes);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}